

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O2

Map_HashTable_t * Map_SuperTableCreate(Map_SuperLib_t *pLib)

{
  int iVar1;
  Map_HashTable_t *pMVar2;
  Map_HashEntry_t **ppMVar3;
  
  pMVar2 = (Map_HashTable_t *)calloc(1,0x18);
  pMVar2->mmMan = pLib->mmEntries;
  iVar1 = Abc_PrimeCudd(20000);
  pMVar2->nBins = iVar1;
  ppMVar3 = (Map_HashEntry_t **)calloc(1,(long)iVar1 << 3);
  pMVar2->pBins = ppMVar3;
  return pMVar2;
}

Assistant:

Map_HashTable_t * Map_SuperTableCreate( Map_SuperLib_t * pLib )
{
    Map_HashTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Map_HashTable_t, 1 );
    memset( p, 0, sizeof(Map_HashTable_t) );
    p->mmMan = pLib->mmEntries;
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(20000);
    p->pBins = ABC_ALLOC( Map_HashEntry_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Map_HashEntry_t *) * p->nBins );
    return p;
}